

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  uint uVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  int iVar4;
  HashElem *pHVar5;
  Vdbe *p;
  Schema **ppSVar6;
  char *zArg1;
  int p1;
  ulong uVar7;
  
  psVar2 = pParse->db;
  if (pTrigger->pSchema == (Schema *)0x0) {
    uVar7 = 0xfff0bdc0;
  }
  else {
    uVar1 = psVar2->nDb;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    else {
      ppSVar6 = &psVar2->aDb->pSchema;
      uVar7 = 0;
      do {
        if (*ppSVar6 == pTrigger->pSchema) goto LAB_0023ee89;
        uVar7 = uVar7 + 1;
        ppSVar6 = ppSVar6 + 4;
      } while (uVar1 != uVar7);
      uVar7 = (ulong)uVar1;
    }
  }
LAB_0023ee89:
  pHVar5 = findElementWithHash(&pTrigger->pTabSchema->tblHash,pTrigger->table,(uint *)0x0);
  p1 = (int)uVar7;
  pcVar3 = psVar2->aDb[p1].zDbSName;
  iVar4 = sqlite3AuthCheck(pParse,(uint)(p1 != 1) * 2 + 0xe,pTrigger->zName,*pHVar5->data,pcVar3);
  if (iVar4 == 0) {
    zArg1 = "sqlite_master";
    if (p1 == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar4 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,pcVar3);
    if (iVar4 == 0) {
      p = pParse->pVdbe;
      if (p == (Vdbe *)0x0) {
        p = allocVdbe(pParse);
      }
      if (p != (Vdbe *)0x0) {
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'trigger\'",
                           psVar2->aDb[p1].zDbSName,"sqlite_master",pTrigger->zName);
        sqlite3VdbeAddOp3(pParse->pVdbe,0x66,p1,1,(pParse->db->aDb[p1].pSchema)->schema_cookie + 1);
        pcVar3 = pTrigger->zName;
        iVar4 = sqlite3VdbeAddOp3(p,0x8d,p1,0,0);
        sqlite3VdbeChangeP4(p,iVar4,pcVar3,0);
        return;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( pTable );
  assert( pTable->pSchema==pTrigger->pSchema || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  assert( pTable!=0 );
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}